

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrinter<std::basic_string_view<char,_std::char_traits<char>_>_>::
     Print(basic_string_view<char,_std::char_traits<char>_> *value,ostream *os)

{
  ostream *in_RCX;
  StringView sp;
  
  sp._M_str = (char *)os;
  sp._M_len = (size_t)value->_M_str;
  PrintTo((internal *)value->_M_len,sp,in_RCX);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }